

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O3

void __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeExpVec(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      *vec,DataArray<int> *vecExp)

{
  int *piVar1;
  long lVar2;
  pointer pnVar3;
  pointer pnVar4;
  cpp_dec_float<200U,_int,_void> *pcVar5;
  ulong uVar6;
  uint uVar7;
  byte bVar8;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar8 = 0;
  pnVar3 = (vec->
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((vec->
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pnVar3) {
    piVar1 = vecExp->data;
    uVar7 = 1;
    uVar6 = 0;
    do {
      pnVar4 = pnVar3 + uVar6;
      pcVar5 = &local_b0;
      for (lVar2 = 0x1c; lVar2 != 0; lVar2 = lVar2 + -1) {
        (pcVar5->data)._M_elems[0] = (pnVar4->m_backend).data._M_elems[0];
        pnVar4 = (pointer)((long)pnVar4 + ((ulong)bVar8 * -2 + 1) * 4);
        pcVar5 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar5 + (ulong)bVar8 * -8 + 4);
      }
      local_b0.exp = pnVar3[uVar6].m_backend.exp;
      local_b0.neg = pnVar3[uVar6].m_backend.neg;
      local_b0.fpclass = pnVar3[uVar6].m_backend.fpclass;
      local_b0.prec_elem = pnVar3[uVar6].m_backend.prec_elem;
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 0x1c;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems[6] = 0;
      local_138.data._M_elems[7] = 0;
      local_138.data._M_elems[8] = 0;
      local_138.data._M_elems[9] = 0;
      local_138.data._M_elems[10] = 0;
      local_138.data._M_elems[0xb] = 0;
      local_138.data._M_elems[0xc] = 0;
      local_138.data._M_elems[0xd] = 0;
      local_138.data._M_elems[0xe] = 0;
      local_138.data._M_elems[0xf] = 0;
      local_138.data._M_elems[0x10] = 0;
      local_138.data._M_elems[0x11] = 0;
      local_138.data._M_elems[0x12] = 0;
      local_138.data._M_elems[0x13] = 0;
      local_138.data._M_elems[0x14] = 0;
      local_138.data._M_elems[0x15] = 0;
      local_138.data._M_elems[0x16] = 0;
      local_138.data._M_elems[0x17] = 0;
      local_138.data._M_elems[0x18] = 0;
      local_138.data._M_elems[0x19] = 0;
      local_138.data._M_elems._104_5_ = 0;
      local_138.data._M_elems[0x1b]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      boost::multiprecision::backends::eval_frexp<200u,int,void>
                (&local_138,&local_b0,piVar1 + (int)(uVar7 - 1));
      piVar1 = vecExp->data;
      piVar1[(int)(uVar7 - 1)] = piVar1[(int)(uVar7 - 1)] + -1;
      uVar6 = (ulong)uVar7;
      pnVar3 = (vec->
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar7 = uVar7 + 1;
    } while (uVar6 < (ulong)((long)(vec->
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar3 >> 7))
    ;
  }
  return;
}

Assistant:

void SPxScaler<R>::computeExpVec(const std::vector<R>& vec, DataArray<int>& vecExp)
{
   assert(vec.size() == unsigned(vecExp.size()));

   for(unsigned i = 0; i < vec.size(); ++i)
   {
      spxFrexp(vec[i], &(vecExp[int(i)]));
      vecExp[int(i)] -= 1;
   }
}